

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Hpipe::Vec<std::__cxx11::string>::push_back_unique<char_const(&)[244]>
          (Vec<std::__cxx11::string> *this,char (*val) [244])

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = *(long *)this;
  if (*(long *)(this + 8) != lVar3) {
    uVar2 = 1;
    uVar4 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)(lVar3 + uVar4 * 0x20));
      if (iVar1 == 0) {
        return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (uVar4 * 0x20 + *(long *)this);
      }
      uVar4 = (ulong)uVar2;
      lVar3 = *(long *)this;
      uVar2 = uVar2 + 1;
    } while (uVar4 < (ulong)(*(long *)(this + 8) - lVar3 >> 5));
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[244]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,val);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (*(long *)(this + 8) + -0x20);
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }